

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void check_mkstemp_result(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  int r;
  uv_fs_t *req_local;
  
  if (req->fs_type != UV_FS_MKSTEMP) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x22b,"req->fs_type == UV_FS_MKSTEMP");
    abort();
  }
  if (req->result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x22c,"req->result >= 0");
    abort();
  }
  if (req->path == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x22d,"req->path");
    abort();
  }
  sVar2 = strlen(req->path);
  if (sVar2 != 0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x22e,"strlen(req->path) == 16");
    abort();
  }
  iVar1 = memcmp(req->path,"test_file_",10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x22f,"memcmp(req->path, \"test_file_\", 10) == 0");
    abort();
  }
  iVar1 = memcmp(req->path + 10,"XXXXXX",6);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x230,"memcmp(req->path + 10, \"XXXXXX\", 6) != 0");
    abort();
  }
  check_permission(req->path,0x180);
  iVar1 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,req->path,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x235,"r == 0");
    abort();
  }
  if ((stat_req.statbuf.st_mode & 0x8000) == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x236,"stat_req.statbuf.st_mode & S_IFREG");
    abort();
  }
  uv_fs_req_cleanup(&stat_req);
  return;
}

Assistant:

static void check_mkstemp_result(uv_fs_t* req) {
  int r;

  ASSERT(req->fs_type == UV_FS_MKSTEMP);
  ASSERT(req->result >= 0);
  ASSERT(req->path);
  ASSERT(strlen(req->path) == 16);
  ASSERT(memcmp(req->path, "test_file_", 10) == 0);
  ASSERT(memcmp(req->path + 10, "XXXXXX", 6) != 0);
  check_permission(req->path, 0600);

  /* Check if req->path is actually a file */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_mode & S_IFREG);
  uv_fs_req_cleanup(&stat_req);
}